

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::MatcherBase<phmap::priv::(anonymous_namespace)::BadTable_const&>::
GetDescriberImpl<testing::internal::MatcherBase<phmap::priv::(anonymous_namespace)::BadTable_const&>::ValuePolicy<testing::MatcherInterface<phmap::priv::(anonymous_namespace)::BadTable_const&>const*,true>>
          (MatcherBase<const_phmap::priv::(anonymous_namespace)::BadTable_&> *m)

{
  __tuple_element_t<1UL,_tuple<const_MatcherBase<const_BadTable_&>_*,_const_MatcherInterface<const_BadTable_&>_*>_>
  *ppMVar1;
  MatcherBase<const_phmap::priv::(anonymous_namespace)::BadTable_&> *local_28;
  tuple<const_testing::internal::MatcherBase<const_phmap::priv::(anonymous_namespace)::BadTable_&>_*,_const_testing::MatcherInterface<const_phmap::priv::(anonymous_namespace)::BadTable_&>_*>
  local_20;
  MatcherBase<const_phmap::priv::(anonymous_namespace)::BadTable_&> *local_10;
  MatcherBase<const_phmap::priv::(anonymous_namespace)::BadTable_&> *m_local;
  
  local_28 = m;
  local_10 = m;
  MatcherBase<const_phmap::priv::(anonymous_namespace)::BadTable_&>::
  ValuePolicy<const_testing::MatcherInterface<const_phmap::priv::(anonymous_namespace)::BadTable_&>_*,_true>
  ::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<phmap::priv::(anonymous_namespace)::BadTable_const&>const*,testing::MatcherInterface<phmap::priv::(anonymous_namespace)::BadTable_const&>const*>
            ((MatcherBase<const_phmap::priv::(anonymous_namespace)::BadTable_&> **)&local_20,
             (MatcherInterface<const_phmap::priv::(anonymous_namespace)::BadTable_&> **)&local_28);
  ppMVar1 = std::
            get<1ul,testing::internal::MatcherBase<phmap::priv::(anonymous_namespace)::BadTable_const&>const*,testing::MatcherInterface<phmap::priv::(anonymous_namespace)::BadTable_const&>const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }